

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extradata.cpp
# Opt level: O3

void __thiscall
icu_63::ExtraData::writeCompositions(ExtraData *this,UChar32 c,Norm *norm,UnicodeString *dataString)

{
  short sVar1;
  uint uVar2;
  UVector32 *pUVar3;
  int32_t *piVar4;
  UBool UVar5;
  UChar UVar6;
  UChar32 c_00;
  int iVar7;
  int32_t iVar8;
  Norm *pNVar9;
  UnicodeString *pUVar10;
  char *extraout_RAX;
  uint extraout_EDX;
  Norm *norm_00;
  uint uVar12;
  uint uVar13;
  ExtraData *pEVar14;
  ExtraData *this_00;
  uint uVar15;
  ulong uVar16;
  Hashtable *previousMappings;
  int32_t iVar17;
  UChar local_46;
  UChar local_44;
  UChar local_42;
  ulong local_40;
  ExtraData *local_38;
  char *pcVar11;
  
  local_38 = this;
  if (norm->cc == '\0') {
    pUVar3 = norm->compositions;
    if ((pUVar3 != (UVector32 *)0x0) && (1 < pUVar3->count)) {
      piVar4 = pUVar3->elements;
      uVar15 = (uint)pUVar3->count >> 1;
      local_40 = (ulong)(uVar15 - 1);
      uVar16 = 0;
      do {
        iVar7 = piVar4[uVar16 * 2 + 1];
        pNVar9 = Norms::getNormRef((local_38->super_Enumerator).norms,iVar7);
        uVar12 = (uint)(pNVar9->compositions != (UVector32 *)0x0) + iVar7 * 2;
        uVar2 = piVar4[uVar16 * 2];
        uVar13 = uVar12;
        if ((int)uVar2 < 0x3400) {
          UVar6 = (short)uVar2 * 2;
          if ((int)uVar12 < 0x10000) {
            uVar13 = 0xffffffff;
          }
          else {
            UVar6 = UVar6 | 1;
            uVar12 = (uint)(iVar7 * 2) >> 0x10;
          }
        }
        else {
          UVar6 = ((ushort)(uVar2 >> 9) | 1) + L'㐀';
          uVar12 = iVar7 * 2 >> 0x10 | uVar2 << 6;
        }
        local_46 = UVar6 | 0x8000;
        if (local_40 != uVar16) {
          local_46 = UVar6;
        }
        pUVar10 = UnicodeString::doAppend(dataString,&local_46,0,1);
        local_44 = (UChar)uVar12;
        UnicodeString::doAppend(pUVar10,&local_44,0,1);
        if (-1 < (int)uVar13) {
          local_42 = (UChar)uVar13;
          UnicodeString::doAppend(dataString,&local_42,0,1);
        }
        uVar16 = uVar16 + 1;
      } while (uVar15 != uVar16);
    }
    return;
  }
  pEVar14 = (ExtraData *)(ulong)(uint)c;
  writeCompositions(pEVar14);
  if (c == extraout_EDX) {
    pcVar11 = ((Norm *)dataString)->error;
    if (pcVar11 == (char *)0x0) {
      writeExtraData(pEVar14,c,(Norm *)dataString);
      return;
    }
  }
  else {
    c = extraout_EDX;
    rangeHandler();
    pcVar11 = extraout_RAX;
  }
  c_00 = (UChar32)pcVar11;
  this_00 = (ExtraData *)(ulong)(uint)c;
  rangeHandler();
  pEVar14 = this_00;
  switch(norm_00->type) {
  case INERT:
  case MAYBE_YES_SIMPLE:
  case YES_YES_WITH_CC:
    goto switchD_001df820_caseD_1;
  case YES_YES_COMBINES_FWD:
    pUVar10 = &this_00->yesYesCompositions;
    sVar1 = (this_00->yesYesCompositions).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar7 = (this_00->yesYesCompositions).fUnion.fFields.fLength;
    }
    else {
LAB_001df88e:
      iVar7 = (int)sVar1 >> 5;
    }
    goto LAB_001df891;
  case YES_NO_COMBINES_FWD:
    pUVar10 = &this_00->yesNoMappingsAndCompositions;
    sVar1 = (this_00->yesNoMappingsAndCompositions).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar8 = (this_00->yesNoMappingsAndCompositions).fUnion.fFields.fLength;
    }
    else {
      iVar8 = (int)sVar1 >> 5;
    }
    iVar17 = writeMapping(this_00,c_00,norm_00,pUVar10);
    norm_00->offset = iVar17 + iVar8;
    goto LAB_001df926;
  case YES_NO_MAPPING_ONLY:
    sVar1 = (this_00->yesNoMappingsOnly).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar17 = (this_00->yesNoMappingsOnly).fUnion.fFields.fLength;
    }
    else {
      iVar17 = (int)sVar1 >> 5;
    }
    iVar8 = writeMapping(this_00,c_00,norm_00,&this_00->yesNoMappingsOnly);
    iVar8 = iVar8 + iVar17;
    goto LAB_001df944;
  case NO_NO_COMP_YES:
    if ((this_00->optimizeFast == '\0') &&
       (UVar5 = setNoNoDelta(this_00,c_00,norm_00), UVar5 != '\0')) {
      return;
    }
    pUVar10 = &this_00->noNoMappingsCompYes;
    previousMappings = &this_00->previousNoNoMappingsCompYes;
    break;
  case NO_NO_COMP_BOUNDARY_BEFORE:
    if ((this_00->optimizeFast == '\0') &&
       (UVar5 = setNoNoDelta(this_00,c_00,norm_00), UVar5 != '\0')) {
      return;
    }
    pUVar10 = &this_00->noNoMappingsCompBoundaryBefore;
    previousMappings = &this_00->previousNoNoMappingsCompBoundaryBefore;
    break;
  case NO_NO_COMP_NO_MAYBE_CC:
    pUVar10 = &this_00->noNoMappingsCompNoMaybeCC;
    previousMappings = &this_00->previousNoNoMappingsCompNoMaybeCC;
    break;
  case NO_NO_EMPTY:
    pUVar10 = &this_00->noNoMappingsEmpty;
    previousMappings = &this_00->previousNoNoMappingsEmpty;
    break;
  default:
    exit(5);
  case MAYBE_YES_COMBINES_FWD:
    pUVar10 = &this_00->maybeYesCompositions;
    sVar1 = (this_00->maybeYesCompositions).fUnion.fStackFields.fLengthAndFlags;
    if (-1 < sVar1) goto LAB_001df88e;
    iVar7 = (this_00->maybeYesCompositions).fUnion.fFields.fLength;
LAB_001df891:
    norm_00->offset = iVar7;
LAB_001df926:
    writeCompositions(this_00,c_00,norm_00,pUVar10);
    return;
  }
  iVar8 = writeNoNoMapping(pEVar14,c_00,norm_00,pUVar10,previousMappings);
LAB_001df944:
  norm_00->offset = iVar8;
switchD_001df820_caseD_1:
  return;
}

Assistant:

void ExtraData::writeCompositions(UChar32 c, const Norm &norm, UnicodeString &dataString) {
    if(norm.cc!=0) {
        fprintf(stderr,
                "gennorm2 error: "
                "U+%04lX combines-forward and has ccc!=0, not possible in Unicode normalization\n",
                (long)c);
        exit(U_INVALID_FORMAT_ERROR);
    }
    int32_t length;
    const CompositionPair *pairs=norm.getCompositionPairs(length);
    for(int32_t i=0; i<length; ++i) {
        const CompositionPair &pair=pairs[i];
        // 22 bits for the composite character and whether it combines forward.
        UChar32 compositeAndFwd=pair.composite<<1;
        if(norms.getNormRef(pair.composite).compositions!=NULL) {
            compositeAndFwd|=1;  // The composite character also combines-forward.
        }
        // Encode most pairs in two units and some in three.
        int32_t firstUnit, secondUnit, thirdUnit;
        if(pair.trail<Normalizer2Impl::COMP_1_TRAIL_LIMIT) {
            if(compositeAndFwd<=0xffff) {
                firstUnit=pair.trail<<1;
                secondUnit=compositeAndFwd;
                thirdUnit=-1;
            } else {
                firstUnit=(pair.trail<<1)|Normalizer2Impl::COMP_1_TRIPLE;
                secondUnit=compositeAndFwd>>16;
                thirdUnit=compositeAndFwd;
            }
        } else {
            firstUnit=(Normalizer2Impl::COMP_1_TRAIL_LIMIT+
                       (pair.trail>>Normalizer2Impl::COMP_1_TRAIL_SHIFT))|
                      Normalizer2Impl::COMP_1_TRIPLE;
            secondUnit=(pair.trail<<Normalizer2Impl::COMP_2_TRAIL_SHIFT)|
                       (compositeAndFwd>>16);
            thirdUnit=compositeAndFwd;
        }
        // Set the high bit of the first unit if this is the last composition pair.
        if(i==(length-1)) {
            firstUnit|=Normalizer2Impl::COMP_1_LAST_TUPLE;
        }
        dataString.append((UChar)firstUnit).append((UChar)secondUnit);
        if(thirdUnit>=0) {
            dataString.append((UChar)thirdUnit);
        }
    }
}